

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::checkUsePopupMenu(QToolBarLayout *this)

{
  long lVar1;
  bool bVar2;
  Orientation OVar3;
  Orientation o_00;
  int iVar4;
  QMainWindow *pQVar5;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Orientation o;
  QMainWindow *mw;
  QToolBar *tb;
  QSize *in_stack_00000060;
  QToolBarLayout *in_stack_00000068;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  Orientation in_stack_ffffffffffffffb4;
  undefined1 set;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar6;
  Orientation OVar7;
  
  set = (undefined1)((ulong)in_RDI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::parent((QObject *)0x6fc10a);
  QObject::parent((QObject *)0x6fc119);
  pQVar5 = qobject_cast<QMainWindow*>((QObject *)0x6fc121);
  OVar3 = QToolBar::orientation
                    ((QToolBar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  OVar7 = OVar3;
  if (pQVar5 != (QMainWindow *)0x0) {
    bVar2 = QToolBar::isFloating((QToolBar *)0x6fc150);
    uVar6 = CONCAT13(1,(int3)uVar6);
    OVar7 = OVar3;
    if (!bVar2) {
      QWidget::size((QWidget *)CONCAT44(OVar3,in_stack_ffffffffffffffa8));
      expandedSize(in_stack_00000068,in_stack_00000060);
      o_00 = perp(in_stack_ffffffffffffffb4,(QSize *)CONCAT44(OVar3,in_stack_ffffffffffffffa8));
      QWidget::size((QWidget *)CONCAT44(OVar3,in_stack_ffffffffffffffa8));
      iVar4 = perp(o_00,(QSize *)CONCAT44(OVar3,in_stack_ffffffffffffffa8));
      uVar6 = CONCAT13(iVar4 <= (int)o_00,(int3)uVar6);
    }
  }
  setUsePopupMenu((QToolBarLayout *)CONCAT44(OVar7,uVar6),(bool)set);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::checkUsePopupMenu()
{
    QToolBar *tb = static_cast<QToolBar *>(parent());
    QMainWindow *mw = qobject_cast<QMainWindow *>(tb->parent());
    Qt::Orientation o = tb->orientation();
    setUsePopupMenu(!mw || tb->isFloating() || perp(o, expandedSize(mw->size())) >= perp(o, mw->size()));
}